

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBStringList::splitstr(CBStringList *this,CBStream *b,CBString *s)

{
  int iVar1;
  CBStringException *this_00;
  const_bstring local_88;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  CBString *s_local;
  CBStream *b_local;
  CBStringList *this_local;
  
  local_88 = (const_bstring)0x0;
  if (s != (CBString *)0x0) {
    local_88 = &s->super_tagbstring;
  }
  bstr__cppwrapper_exception.msg.field_2._8_8_ = s;
  iVar1 = bssplitstrcb(b->m_s,local_88,streamSplitCb,this);
  if (iVar1 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"CBString::Split bstream failure",&local_69);
    CBStringException::CBStringException((CBStringException *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_48);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return;
}

Assistant:

void CBStringList::splitstr (const CBStream& b, const CBString& s) {
	if (0 > bssplitstrcb (b.m_s, (bstring) &s, streamSplitCb, 
	                    (void *) this)) {
		bstringThrow ("Split bstream failure");
	}
}